

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<kj::Own<kj::AsyncIoStream>_> __thiscall
kj::Promise<kj::Own<kj::AsyncIoStream>>::attach<kj::Own<kj::ConnectionReceiver>>
          (Promise<kj::Own<kj::AsyncIoStream>> *this,Own<kj::ConnectionReceiver> *attachments)

{
  ConnectionReceiver *pCVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long *in_RDX;
  AttachmentPromiseNode<kj::Own<kj::ConnectionReceiver>_> *pAVar4;
  AttachmentPromiseNode<kj::Own<kj::ConnectionReceiver>_> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::ConnectionReceiver>_>_> OVar5;
  Promise<kj::Own<kj::AsyncIoStream>_> PVar6;
  Own<kj::ConnectionReceiver> local_28;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  local_28.disposer = (Disposer *)*in_RDX;
  local_28.ptr = (ConnectionReceiver *)in_RDX[1];
  in_RDX[1] = 0;
  OVar5 = heap<kj::_::AttachmentPromiseNode<kj::Own<kj::ConnectionReceiver>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::ConnectionReceiver>>
                    ((kj *)&local_18,(Own<kj::_::PromiseNode> *)attachments,&local_28);
  pCVar1 = local_28.ptr;
  pAVar4 = OVar5.ptr;
  uVar2 = (undefined4)uStack_10;
  uVar3 = uStack_10._4_4_;
  uStack_10 = 0;
  *(undefined4 *)this = local_18;
  *(undefined4 *)(this + 4) = uStack_14;
  *(undefined4 *)(this + 8) = uVar2;
  *(undefined4 *)(this + 0xc) = uVar3;
  if (local_28.ptr != (ConnectionReceiver *)0x0) {
    local_28.ptr = (ConnectionReceiver *)0x0;
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,
               pCVar1->_vptr_ConnectionReceiver[-2] + (long)&pCVar1->_vptr_ConnectionReceiver);
    pAVar4 = extraout_RDX;
  }
  PVar6.super_PromiseBase.node.ptr = (PromiseNode *)pAVar4;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::AsyncIoStream>_>)PVar6.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}